

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::request_post_load_init(CVmObjTable *this,vm_obj_id_t obj)

{
  CVmHashEntry *pCVar1;
  CVmObjPageEntry *pCVar2;
  vm_obj_id_t in_ESI;
  CVmObjTable *in_RDI;
  CVmHashEntryPLI *entry;
  vm_obj_id_t in_stack_ffffffffffffffbc;
  CVmHashEntryPLI *this_00;
  size_t in_stack_ffffffffffffffc8;
  CVmHashTable *in_stack_ffffffffffffffd8;
  
  pCVar1 = CVmHashTable::find(in_stack_ffffffffffffffd8,(char *)in_RDI,in_stack_ffffffffffffffc8);
  if (pCVar1 == (CVmHashEntry *)0x0) {
    this_00 = (CVmHashEntryPLI *)in_RDI->post_load_init_table_;
    pCVar1 = (CVmHashEntry *)operator_new(0x30);
    CVmHashEntryPLI::CVmHashEntryPLI(this_00,in_stack_ffffffffffffffbc);
    CVmHashTable::add((CVmHashTable *)in_RDI,pCVar1);
    pCVar2 = get_entry(in_RDI,in_ESI);
    *(ushort *)&pCVar2->field_0x14 = *(ushort *)&pCVar2->field_0x14 & 0xfeff | 0x100;
  }
  return;
}

Assistant:

void CVmObjTable::request_post_load_init(vm_obj_id_t obj)
{
    CVmHashEntryPLI *entry;

    /* check for an existing entry - if there's not one already, add one */
    entry = (CVmHashEntryPLI *)
            post_load_init_table_->find((char *)&obj, sizeof(obj));
    if (entry == 0)
    {
        /* it's not there yet - add a new entry */
        post_load_init_table_->add(new CVmHashEntryPLI(obj));

        /* mark the object as having requested post-load initialization */
        get_entry(obj)->requested_post_load_init_ = TRUE;
    }
}